

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O0

binding_t * add_binding_to_tool(tool_t *tool,gotcha_binding_t *user_binding,int user_binding_size)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  internal_binding_t *piVar4;
  char *pcVar5;
  int in_EDX;
  long in_RSI;
  tool_t *in_RDI;
  internal_binding_t *internal_bindings;
  int i;
  int result;
  binding_t *newbinding;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar6;
  hash_data_t in_stack_ffffffffffffff68;
  hash_cmp_t in_stack_ffffffffffffff70;
  FILE *pFVar7;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  hash_table_t *in_stack_ffffffffffffff88;
  char *local_58;
  int local_30;
  binding_t *local_8;
  
  local_8 = (binding_t *)malloc(0x58);
  local_8->tool = in_RDI;
  piVar4 = (internal_binding_t *)malloc((long)in_EDX << 5);
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    piVar4[local_30].user_binding = (gotcha_binding_t *)(in_RSI + (long)local_30 * 0x18);
    **(undefined8 **)(in_RSI + (long)local_30 * 0x18 + 0x10) = piVar4 + local_30;
    piVar4[local_30].associated_binding_table = local_8;
  }
  local_8->internal_bindings = piVar4;
  local_8->internal_bindings_size = in_EDX;
  iVar1 = create_hashtable(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           (hash_func_t)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffff70);
  pFVar7 = _stderr;
  if (iVar1 == 0) {
    for (local_30 = 0; uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20),
        local_30 < in_EDX; local_30 = local_30 + 1) {
      iVar1 = addto_hashtable((hash_table_t *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      pFVar7 = _stderr;
      if (iVar1 != 0) {
        if (debug_level != 0) {
          uVar2 = gotcha_gettid();
          uVar3 = getpid();
          pcVar5 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                           ,0x2f);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "";
          }
          fprintf(pFVar7,
                  "ERROR [%d/%d][%s:%u] - Could not add hash entry for %s to table for tool %s\n",
                  (ulong)uVar2,(ulong)uVar3,pcVar5 + 1,0x7b,
                  *(undefined8 *)(in_RSI + (long)local_30 * 0x18),in_RDI->tool_name);
        }
        goto LAB_001096d2;
      }
    }
    local_8->next_tool_binding = in_RDI->binding;
    in_RDI->binding = local_8;
    local_8->next_binding = all_bindings;
    all_bindings = local_8;
    if (1 < debug_level) {
      pFVar7 = _stderr;
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      pcVar5 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                       ,0x2f);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      fprintf(pFVar7,"[%d/%d][%s:%u] - Created new binding table of size %d for tool %s\n",
              (ulong)uVar2,(ulong)uVar3,pcVar5 + 1,0x86,CONCAT44(uVar6,in_EDX),in_RDI->tool_name);
    }
  }
  else {
    if (debug_level != 0) {
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      local_58 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                         ,0x2f);
      if (local_58 == (char *)0x0) {
        local_58 = "";
      }
      fprintf(pFVar7,"ERROR [%d/%d][%s:%u] - Could not create hash table for %s\n",(ulong)uVar2,
              (ulong)uVar3,local_58 + 1,0x72,in_RDI->tool_name);
    }
LAB_001096d2:
    if (local_8 != (binding_t *)0x0) {
      free(local_8);
    }
    local_8 = (binding_t *)0x0;
  }
  return local_8;
}

Assistant:

binding_t *add_binding_to_tool(tool_t *tool, struct gotcha_binding_t *user_binding, int user_binding_size)
{
   binding_t *newbinding;
   int result, i;
   newbinding = (binding_t *) gotcha_malloc(sizeof(binding_t));
   newbinding->tool = tool;
   struct internal_binding_t* internal_bindings = (struct internal_binding_t*)gotcha_malloc(sizeof(struct internal_binding_t)*user_binding_size);
   for(i=0;i<user_binding_size;i++){
      internal_bindings[i].user_binding = &user_binding[i];
      *(user_binding[i].function_handle) = &internal_bindings[i];
      internal_bindings[i].associated_binding_table = newbinding;
   }  
   newbinding->internal_bindings = internal_bindings;
   newbinding->internal_bindings_size = user_binding_size;
   result = create_hashtable(&newbinding->binding_hash, user_binding_size * 2, 
                             (hash_func_t) strhash, (hash_cmp_t) gotcha_strcmp);
   if (result != 0) {
      error_printf("Could not create hash table for %s\n", tool->tool_name);
      goto error; // error is a label which frees allocated resources and returns NULL
   }

   for (i = 0; i < user_binding_size; i++) {
      result = addto_hashtable(&newbinding->binding_hash, (void *) user_binding[i].name,
                               (void *) (internal_bindings + i));
      if (result != 0) {
         error_printf("Could not add hash entry for %s to table for tool %s\n", 
                      user_binding[i].name, tool->tool_name);
         goto error; // error is a label which frees allocated resources and returns NULL
      }
   }

   newbinding->next_tool_binding = tool->binding;
   tool->binding = newbinding;

   newbinding->next_binding = all_bindings;
   all_bindings = newbinding;

   debug_printf(2, "Created new binding table of size %d for tool %s\n", user_binding_size, tool->tool_name);
   return newbinding;

  error:
   if (newbinding)
      gotcha_free(newbinding);
   return NULL;
}